

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_hdr_write(BGZF *fp,bam_hdr_t *h)

{
  uint32_t *data;
  uint uVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  bam_hdr_t *data_00;
  uint *puVar4;
  long lVar5;
  int32_t x;
  int32_t name_len;
  char buf [4];
  uint local_3c;
  uint local_38 [2];
  
  local_38[1] = 0x14d4142;
  bgzf_write(fp,local_38 + 1,4);
  data = &h->l_text;
  if ((fp->field_0x2 & 0xc) == 0) {
    bgzf_write(fp,data,4);
    data_00 = h;
    if ((ulong)*data != 0) {
      bgzf_write(fp,h->text,(ulong)*data);
    }
  }
  else {
    uVar1 = *data;
    local_3c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    bgzf_write(fp,&local_3c,4);
    if ((ulong)*data != 0) {
      bgzf_write(fp,h->text,(ulong)*data);
    }
    uVar1 = h->n_targets;
    local_3c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    data_00 = (bam_hdr_t *)&local_3c;
  }
  bgzf_write(fp,data_00,4);
  if (h->n_targets != 0) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      __s = *(char **)((long)h->target_name + lVar5 * 2);
      sVar2 = strlen(__s);
      local_38[0] = (int)sVar2 + 1;
      puVar4 = local_38;
      if ((fp->field_0x2 & 0xc) != 0) {
        local_3c = local_38[0] >> 0x18 | (local_38[0] & 0xff0000) >> 8 | (local_38[0] & 0xff00) << 8
                   | local_38[0] * 0x1000000;
        puVar4 = &local_3c;
      }
      bgzf_write(fp,puVar4,4);
      bgzf_write(fp,__s,(long)(int)local_38[0]);
      if ((fp->field_0x2 & 0xc) == 0) {
        puVar4 = (uint *)((long)h->target_len + lVar5);
      }
      else {
        uVar1 = *(uint *)((long)h->target_len + lVar5);
        local_3c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        puVar4 = &local_3c;
      }
      bgzf_write(fp,puVar4,4);
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 4;
    } while (uVar3 != (uint)h->n_targets);
  }
  bgzf_flush(fp);
  return 0;
}

Assistant:

int bam_hdr_write(BGZF *fp, const bam_hdr_t *h)
{
    char buf[4];
    int32_t i, name_len, x;
    // write "BAM1"
    strncpy(buf, "BAM\1", 4);
    bgzf_write(fp, buf, 4);
    // write plain text and the number of reference sequences
    if (fp->is_be) {
        x = ed_swap_4(h->l_text);
        bgzf_write(fp, &x, 4);
        if (h->l_text) bgzf_write(fp, h->text, h->l_text);
        x = ed_swap_4(h->n_targets);
        bgzf_write(fp, &x, 4);
    } else {
        bgzf_write(fp, &h->l_text, 4);
        if (h->l_text) bgzf_write(fp, h->text, h->l_text);
        bgzf_write(fp, &h->n_targets, 4);
    }
    // write sequence names and lengths
    for (i = 0; i != h->n_targets; ++i) {
        char *p = h->target_name[i];
        name_len = strlen(p) + 1;
        if (fp->is_be) {
            x = ed_swap_4(name_len);
            bgzf_write(fp, &x, 4);
        } else bgzf_write(fp, &name_len, 4);
        bgzf_write(fp, p, name_len);
        if (fp->is_be) {
            x = ed_swap_4(h->target_len[i]);
            bgzf_write(fp, &x, 4);
        } else bgzf_write(fp, &h->target_len[i], 4);
    }
    bgzf_flush(fp);
    return 0;
}